

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O3

bool __thiscall
draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::DecodeTransformData
          (PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *this,
          DecoderBuffer *buffer)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  lVar1 = buffer->pos_;
  if (lVar1 + 4 <= buffer->data_size_) {
    uVar2 = *(uint *)(buffer->data_ + lVar1);
    buffer->pos_ = lVar1 + 4;
    if ((lVar1 + 8 <= buffer->data_size_) && (buffer->pos_ = lVar1 + 8, (uVar2 & 1) != 0)) {
      uVar3 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
      if (uVar3 - 2 < 0x1d) {
        uVar4 = -1 << (-(char)uVar3 & 0x1fU);
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        quantization_bits_ = 0x20 - uVar3;
        uVar2 = -uVar4 - 2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        max_quantized_value_ = ~uVar4;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.max_value_ =
             uVar2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.
        dequantization_scale_ = 2.0 / (float)(int)uVar2;
        (this->super_PredictionSchemeNormalOctahedronCanonicalizedTransformBase<int>).
        super_PredictionSchemeNormalOctahedronTransformBase<int>.octahedron_tool_box_.center_value_
             = uVar2 >> 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }